

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::updateCurrentSubroutineSet
          (FunctionalTest20_21 *this,subroutineUniformSet *set)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  subroutineUniformSet *set_local;
  FunctionalTest20_21 *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x1668))(0x8b30,1,&set->m_fragment_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x293c);
  (**(code **)(lVar4 + 0x1668))(0x8dd9,1,&set->m_geometry_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2940);
  (**(code **)(lVar4 + 0x1668))(0x8e88,1,&set->m_tesselation_control_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2944);
  (**(code **)(lVar4 + 0x1668))(0x8e87,1,&set->m_tesselation_evaluation_shader_stage);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2948);
  (**(code **)(lVar4 + 0x1668))(0x8b31,1,set);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"UniformSubroutinesuiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x294c);
  return;
}

Assistant:

void FunctionalTest20_21::updateCurrentSubroutineSet(const subroutineUniformSet& set)
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fragment */
	gl.uniformSubroutinesuiv(GL_FRAGMENT_SHADER, 1 /* count */, &set.m_fragment_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Geometry */
	gl.uniformSubroutinesuiv(GL_GEOMETRY_SHADER, 1 /* count */, &set.m_geometry_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Tess ctrl */
	gl.uniformSubroutinesuiv(GL_TESS_CONTROL_SHADER, 1 /* count */, &set.m_tesselation_control_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Tess eval */
	gl.uniformSubroutinesuiv(GL_TESS_EVALUATION_SHADER, 1 /* count */, &set.m_tesselation_evaluation_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");

	/* Vertex */
	gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 1 /* count */, &set.m_vertex_shader_stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UniformSubroutinesuiv");
}